

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

int reserve_buf(nghttp3_buf *buf,size_t extra_size,nghttp3_mem *mem)

{
  int iVar1;
  uint uVar2;
  nghttp3_mem *mem_00;
  size_t sVar3;
  size_t in_RDX;
  nghttp3_mem *in_RSI;
  nghttp3_buf *in_RDI;
  size_t n;
  size_t left;
  int local_4;
  
  mem_00 = (nghttp3_mem *)nghttp3_buf_left(in_RDI);
  if (mem_00 < in_RSI) {
    sVar3 = nghttp3_buf_cap(in_RDI);
    sVar3 = nghttp3_max_size(0x20,(long)in_RSI + (sVar3 - (long)mem_00));
    if (sVar3 < 0x80000001) {
      uVar2 = (int)sVar3 - 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      local_4 = nghttp3_buf_reserve((nghttp3_buf *)in_RSI,in_RDX,mem_00);
    }
    else {
      local_4 = -0x385;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int reserve_buf(nghttp3_buf *buf, size_t extra_size,
                       const nghttp3_mem *mem) {
  size_t left = nghttp3_buf_left(buf);
  size_t n = 32;

  if (left >= extra_size) {
    return 0;
  }

  n = nghttp3_max_size(n, nghttp3_buf_cap(buf) + extra_size - left);

  /* Check whether we are requesting too much memory */
  if (n > (1u << 31)) {
    return NGHTTP3_ERR_NOMEM;
  }

#ifndef WIN32
  n = 1u << (32 - __builtin_clz((uint32_t)n - 1));
#else  /* defined(WIN32) */
  /* Round up to the next highest power of 2 from Bit Twiddling
     Hacks */
  --n;
  n |= n >> 1;
  n |= n >> 2;
  n |= n >> 4;
  n |= n >> 8;
  n |= n >> 16;
  ++n;
#endif /* defined(WIN32) */

  return nghttp3_buf_reserve(buf, n, mem);
}